

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

int Mpm_CutGetArea(Mpm_Man_t *p,Mpm_Cut_t *pCut)

{
  Mpm_Par_t *pMVar1;
  Mpm_Dsd_t *pMVar2;
  uint uVar3;
  int iVar4;
  
  pMVar1 = p->pPars;
  if (pMVar1->fMap4Cnf == 0) {
    if (pMVar1->fMap4Aig == 0) {
      if (pMVar1->fMap4Gates == 0) {
        iVar4 = p->pLibLut->pLutAreas[*(uint *)&pCut->field_0x4 >> 0x1b];
      }
      else {
        iVar4 = 0x14;
      }
    }
    else {
      pMVar2 = p->pDsd6;
      uVar3 = Abc_Lit2Var(*(uint *)&pCut->field_0x4 & 0x1ffffff);
      iVar4 = pMVar2[uVar3].nAnds * 0x14;
    }
  }
  else {
    pMVar2 = p->pDsd6;
    uVar3 = Abc_Lit2Var(*(uint *)&pCut->field_0x4 & 0x1ffffff);
    iVar4 = pMVar2[uVar3].nClauses * 0x14;
  }
  return iVar4;
}

Assistant:

static inline int Mpm_CutGetArea( Mpm_Man_t * p, Mpm_Cut_t * pCut )  
{
    if ( p->pPars->fMap4Cnf )
        return MPM_UNIT_AREA * p->pDsd6[Abc_Lit2Var(pCut->iFunc)].nClauses;
    if ( p->pPars->fMap4Aig )
        return MPM_UNIT_AREA * p->pDsd6[Abc_Lit2Var(pCut->iFunc)].nAnds;
    if ( p->pPars->fMap4Gates )
        return MPM_UNIT_AREA * 1;
    return p->pLibLut->pLutAreas[pCut->nLeaves];
}